

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NodeImpl.hh
# Opt level: O1

void __thiscall
avro::
NodeImpl<avro::concepts::NoAttribute<avro::Name>,_avro::concepts::SingleAttribute<boost::shared_ptr<avro::Node>_>,_avro::concepts::NoAttribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_avro::concepts::NoAttribute<int>_>
::setLeafToSymbolic(NodeImpl<avro::concepts::NoAttribute<avro::Name>,_avro::concepts::SingleAttribute<boost::shared_ptr<avro::Node>_>,_avro::concepts::NoAttribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_avro::concepts::NoAttribute<int>_>
                    *this,int index,NodePtr *node)

{
  element_type *peVar1;
  sp_counted_base *psVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  shared_ptr<avro::Node> *psVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  NodeSymbolic *p;
  undefined4 extraout_var_01;
  undefined8 *puVar7;
  shared_ptr<avro::Node> local_48;
  element_type local_38;
  
  psVar6 = concepts::SingleAttribute<boost::shared_ptr<avro::Node>_>::get
                     (&this->leafAttributes_,(long)index);
  iVar4 = (*psVar6->px->_vptr_Node[3])();
  iVar5 = (*node->px->_vptr_Node[3])();
  bVar3 = Name::operator==((Name *)CONCAT44(extraout_var,iVar4),
                           (Name *)CONCAT44(extraout_var_00,iVar5));
  if (bVar3) {
    p = (NodeSymbolic *)operator_new(0x68);
    (p->super_NodeImplSymbolic).super_Node.type_ = AVRO_NUM_TYPES;
    (p->super_NodeImplSymbolic).super_Node.locked_ = false;
    (p->super_NodeImplSymbolic).nameAttribute_.attr_.ns_._M_dataplus._M_p =
         (pointer)&(p->super_NodeImplSymbolic).nameAttribute_.attr_.ns_.field_2;
    (p->super_NodeImplSymbolic).nameAttribute_.attr_.ns_._M_string_length = 0;
    (p->super_NodeImplSymbolic).nameAttribute_.attr_.ns_.field_2._M_local_buf[0] = '\0';
    (p->super_NodeImplSymbolic).nameAttribute_.attr_.simpleName_._M_dataplus._M_p =
         (pointer)&(p->super_NodeImplSymbolic).nameAttribute_.attr_.simpleName_.field_2;
    (p->super_NodeImplSymbolic).nameAttribute_.attr_.simpleName_._M_string_length = 0;
    (p->super_NodeImplSymbolic).nameAttribute_.attr_.simpleName_.field_2._M_local_buf[0] = '\0';
    (p->super_NodeImplSymbolic).super_Node._vptr_Node = (_func_int **)&PTR__NodeSymbolic_001cea20;
    (p->actualNode_).px = (element_type *)0x0;
    (p->actualNode_).pn.pi_ = (sp_counted_base *)0x0;
    boost::shared_ptr<avro::Node>::shared_ptr<avro::NodeSymbolic>(&local_48,p);
    peVar1 = local_48.px;
    iVar4 = (*node->px->_vptr_Node[3])();
    Node::checkLock(peVar1);
    (*peVar1->_vptr_Node[0x10])(peVar1,CONCAT44(extraout_var_01,iVar4));
    (*peVar1->_vptr_Node[0x11])(peVar1,CONCAT44(extraout_var_01,iVar4));
    *(element_type **)&peVar1[5].type_ = node->px;
    boost::detail::weak_count::operator=((weak_count *)(peVar1 + 6),&node->pn);
    peVar1 = psVar6->px;
    psVar2 = (psVar6->pn).pi_;
    psVar6->px = local_48.px;
    (psVar6->pn).pi_ = local_48.pn.pi_;
    local_48.px = peVar1;
    local_48.pn.pi_ = psVar2;
    boost::detail::shared_count::~shared_count(&local_48.pn);
    return;
  }
  puVar7 = (undefined8 *)__cxa_allocate_exception(0x18);
  local_48.px = &local_38;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_48,"Symbolic name does not match the name of the schema it references"
             ,"");
  std::runtime_error::runtime_error((runtime_error *)(puVar7 + 1),(string *)&local_48);
  *puVar7 = 0x1cd6f0;
  puVar7[1] = 0x1cd720;
  __cxa_throw(puVar7,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

inline void 
NodeImpl<A,B,C,D>::setLeafToSymbolic(int index, const NodePtr &node)
{
    if(!B::hasAttribute) {
        throw Exception("Cannot change leaf node for nonexistent leaf");
    } 

    NodePtr &replaceNode = const_cast<NodePtr &>(leafAttributes_.get(index));
    if(replaceNode->name() != node->name()) {
        throw Exception("Symbolic name does not match the name of the schema it references");
    }

    NodePtr symbol(new NodeSymbolic);
    NodeSymbolic *ptr = static_cast<NodeSymbolic *> (symbol.get());

    ptr->setName(node->name());
    ptr->setNode(node);
    replaceNode.swap(symbol);
}